

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_colorf_hsva_fv(float *hsva,nk_colorf in)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar6 = in._8_8_;
  uVar3 = in._0_8_;
  fVar1 = in.g;
  fVar7 = in.b;
  fVar8 = (float)(-(uint)(fVar1 < fVar7) & 0xbf800000);
  if (fVar1 < fVar7) {
    uVar3 = CONCAT44(fVar7,in.r);
    uVar6 = CONCAT44(in.a,fVar1);
  }
  fVar1 = (float)uVar3;
  fVar7 = (float)((ulong)uVar3 >> 0x20);
  if (fVar1 < fVar7) {
    uVar3 = CONCAT44(fVar1,fVar7);
  }
  fVar2 = (float)uVar3;
  fVar4 = (float)((ulong)uVar3 >> 0x20);
  fVar5 = (float)uVar6;
  fVar9 = fVar4;
  if (fVar5 <= fVar4) {
    fVar9 = fVar5;
  }
  fVar7 = (float)(~-(uint)(fVar1 < fVar7) & (uint)fVar8 |
                 (uint)(-0.33333334 - fVar8) & -(uint)(fVar1 < fVar7)) +
          (fVar4 - fVar5) / ((fVar2 - fVar9) * 6.0 + 1e-20);
  fVar1 = -fVar7;
  if (-fVar7 <= fVar7) {
    fVar1 = fVar7;
  }
  *hsva = fVar1;
  hsva[1] = (fVar2 - fVar9) / (fVar2 + 1e-20);
  hsva[2] = fVar2;
  hsva[3] = (float)((ulong)uVar6 >> 0x20);
  return;
}

Assistant:

NK_API void
nk_colorf_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_colorf in)
{
    float chroma;
    float K = 0.0f;
    if (in.g < in.b) {
        const float t = in.g; in.g = in.b; in.b = t;
        K = -1.f;
    }
    if (in.r < in.g) {
        const float t = in.r; in.r = in.g; in.g = t;
        K = -2.f/6.0f - K;
    }
    chroma = in.r - ((in.g < in.b) ? in.g: in.b);
    *out_h = NK_ABS(K + (in.g - in.b)/(6.0f * chroma + 1e-20f));
    *out_s = chroma / (in.r + 1e-20f);
    *out_v = in.r;
    *out_a = in.a;

}